

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

bool __thiscall ONX_Model::Write(ONX_Model *this,char *filename,int version,ON_TextLog *error_log)

{
  bool bVar1;
  FILE *fp;
  wchar_t *archive_full_path;
  ON_wString wFileName;
  ON_BinaryFile file;
  ON_wString local_260;
  ON_BinaryFile local_258;
  
  if (((filename != (char *)0x0) && (*filename != '\0')) &&
     (fp = ON::OpenFile(filename,"wb"), fp != (FILE *)0x0)) {
    ON_BinaryFile::ON_BinaryFile(&local_258,write3dm,fp);
    ON_wString::ON_wString(&local_260,filename);
    archive_full_path = ON_wString::operator_cast_to_wchar_t_(&local_260);
    ON_BinaryArchive::SetArchiveFullPath(&local_258.super_ON_BinaryArchive,archive_full_path);
    bVar1 = Write(this,&local_258.super_ON_BinaryArchive,version,error_log);
    ON::CloseFile(fp);
    ON_wString::~ON_wString(&local_260);
    ON_BinaryFile::~ON_BinaryFile(&local_258);
    return bVar1;
  }
  return false;
}

Assistant:

bool ONX_Model::Write(const char* filename, int version, ON_TextLog* error_log) const
{
  bool rc = false;

  if (nullptr != filename && 0 != filename[0])
  {
    FILE* fp = ON::OpenFile(filename, "wb");
    if (nullptr != fp)
    {
      ON_BinaryFile file(ON::archive_mode::write3dm, fp);
      const ON_wString wFileName(filename);
      file.SetArchiveFullPath(static_cast<const wchar_t*>(wFileName));
      rc = Write(file, version, error_log);
      ON::CloseFile(fp);
    }
  }

  return rc;
}